

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

void * merge(void *a,void *b,_func_int_varargs *cmp,size_t offset)

{
  void *pvVar1;
  void *pvVar2;
  int iVar3;
  void *pvVar4;
  
  if (b != (void *)0x0) {
    iVar3 = (*cmp)(a);
    if (iVar3 < 1) {
      pvVar1 = a;
      pvVar2 = *(void **)((long)a + offset);
      pvVar4 = b;
    }
    else {
      pvVar1 = b;
      pvVar2 = a;
      pvVar4 = *(void **)((long)b + offset);
      a = b;
    }
    while ((pvVar2 != (void *)0x0 && (pvVar4 != (void *)0x0))) {
      iVar3 = (*cmp)(pvVar2,pvVar4);
      if (iVar3 < 1) {
        *(void **)((long)pvVar1 + offset) = pvVar2;
        pvVar1 = pvVar2;
        pvVar2 = *(void **)((long)pvVar2 + offset);
      }
      else {
        *(void **)((long)pvVar1 + offset) = pvVar4;
        pvVar1 = pvVar4;
        pvVar4 = *(void **)((long)pvVar4 + offset);
      }
    }
    if (pvVar2 != (void *)0x0) {
      pvVar4 = pvVar2;
    }
    *(void **)((long)pvVar1 + offset) = pvVar4;
  }
  return a;
}

Assistant:

static void *merge(void *a,void *b,int (*cmp)(),size_t offset)
{
  char *ptr, *head;

  if( a==0 ){
    head = b;
  }else if( b==0 ){
    head = a;
  }else{
    if( (*cmp)(a,b)<=0 ){
      ptr = a;
      a = NEXT(a);
    }else{
      ptr = b;
      b = NEXT(b);
    }
    head = ptr;
    while( a && b ){
      if( (*cmp)(a,b)<=0 ){
        NEXT(ptr) = a;
        ptr = a;
        a = NEXT(a);
      }else{
        NEXT(ptr) = b;
        ptr = b;
        b = NEXT(b);
      }
    }
    if( a ) NEXT(ptr) = a;
    else    NEXT(ptr) = b;
  }
  return head;
}